

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall perfetto::base::UnixSocket::~UnixSocket(UnixSocket *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  Shutdown(this,true);
  *(this->weak_ptr_factory_).weak_ptr_.handle_.
   super___shared_ptr<perfetto::base::UnixSocket_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type)0x0;
  this_00 = (this->weak_ptr_factory_).weak_ptr_.handle_.
            super___shared_ptr<perfetto::base::UnixSocket_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::reset((ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
           *)this,-1);
  return;
}

Assistant:

UnixSocket::~UnixSocket() {
  // The implicit dtor of |weak_ptr_factory_| will no-op pending callbacks.
  Shutdown(true);
}